

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::Path::Path(Path *this,String *name)

{
  String *pSVar1;
  String *this_00;
  size_t extraout_RDX;
  StringPtr part;
  StringPtr local_38 [2];
  String *local_18;
  String *name_local;
  Path *this_local;
  
  local_18 = name;
  name_local = (String *)this;
  heapArray<kj::String>(&this->parts,1);
  pSVar1 = mv<kj::String>(local_18);
  this_00 = Array<kj::String>::operator[](&this->parts,0);
  String::operator=(this_00,pSVar1);
  pSVar1 = Array<kj::String>::operator[](&this->parts,0);
  StringPtr::StringPtr(local_38,pSVar1);
  part.content.size_ = extraout_RDX;
  part.content.ptr = (char *)local_38[0].content.size_;
  validatePart((Path *)local_38[0].content.ptr,part);
  return;
}

Assistant:

Path::Path(String&& name): parts(heapArray<String>(1)) {
  parts[0] = kj::mv(name);
  validatePart(parts[0]);
}